

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
                 *this,GetterXsYs<unsigned_long_long> *getter1,
                GetterXsYRef<unsigned_long_long> *getter2,TransformerLinLin *transformer,ImU32 col)

{
  ulong uVar1;
  ulong uVar2;
  ImVec2 IVar3;
  unsigned_long_long uVar4;
  int iVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImPlotContext *pIVar8;
  int iVar9;
  long lVar10;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar5 = getter1->Count;
  iVar9 = getter2->Count;
  if (iVar5 < getter2->Count) {
    iVar9 = iVar5;
  }
  this->Prims = iVar9 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar8 = GImPlot;
  (this->P12).y = 0.0;
  lVar10 = (long)((getter1->Offset % iVar5 + iVar5) % iVar5) * (long)getter1->Stride;
  iVar5 = transformer->YAxis;
  uVar1 = *(ulong *)((long)getter1->Ys + lVar10);
  uVar2 = *(ulong *)((long)getter1->Xs + lVar10);
  IVar3 = GImPlot->PixelRange[iVar5].Min;
  IVar6.y = (float)(GImPlot->My[iVar5] *
                    ((((double)(uVar1 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                     (double)(uVar1 & 0xffffffff | 0x4330000000000000)) -
                    GImPlot->CurrentPlot->YAxis[iVar5].Range.Min) + (double)IVar3.y);
  IVar6.x = (float)(GImPlot->Mx *
                    ((((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                     (double)(uVar2 & 0xffffffff | 0x4330000000000000)) -
                    (GImPlot->CurrentPlot->XAxis).Range.Min) + (double)IVar3.x);
  this->P11 = IVar6;
  iVar5 = getter2->Count;
  uVar4 = *(unsigned_long_long *)
           ((long)getter2->Xs +
           (long)((getter2->Offset % iVar5 + iVar5) % iVar5) * (long)getter2->Stride);
  iVar5 = transformer->YAxis;
  IVar3 = pIVar8->PixelRange[iVar5].Min;
  IVar7.y = (float)(pIVar8->My[iVar5] *
                    (getter2->YRef - pIVar8->CurrentPlot->YAxis[iVar5].Range.Min) + (double)IVar3.y)
  ;
  IVar7.x = (float)(pIVar8->Mx *
                    ((((double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) -
                    (pIVar8->CurrentPlot->XAxis).Range.Min) + (double)IVar3.x);
  this->P12 = IVar7;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }